

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

error_code __thiscall
webfront::http::std::experimental::net::v1::detail::
reactive_socket_service<std::experimental::net::v1::ip::tcp>::assign
          (reactive_socket_service<std::experimental::net::v1::ip::tcp> *this,
          implementation_type *impl,protocol_type *protocol,native_handle_type *native_socket,
          error_code *ec)

{
  error_code eVar1;
  
  eVar1 = reactive_socket_service_base::do_assign
                    (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type
                     ,1,native_socket,ec);
  if (eVar1._M_value == 0) {
    (impl->protocol_).family_ = protocol->family_;
  }
  eVar1._4_4_ = 0;
  eVar1._M_value = ec->_M_value;
  eVar1._M_cat = ec->_M_cat;
  return eVar1;
}

Assistant:

std::error_code assign(implementation_type& impl,
      const protocol_type& protocol, const native_handle_type& native_socket,
      std::error_code& ec)
  {
    if (!do_assign(impl, protocol.type(), native_socket, ec))
      impl.protocol_ = protocol;
    return ec;
  }